

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall Clasp::ClaspFacade::SolveData::BoundArray::~BoundArray(BoundArray *this)

{
  pointer ppLVar1;
  size_type sVar2;
  
  sVar2 = (this->refs).ebo_.size;
  while (sVar2 != 0) {
    operator_delete((this->refs).ebo_.buf[sVar2 - 1]);
    sVar2 = (this->refs).ebo_.size - 1;
    (this->refs).ebo_.size = sVar2;
  }
  ppLVar1 = (this->refs).ebo_.buf;
  if (ppLVar1 == (pointer)0x0) {
    return;
  }
  operator_delete(ppLVar1);
  return;
}

Assistant:

~BoundArray() { while (!refs.empty()) { delete refs.back(); refs.pop_back(); } }